

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.c
# Opt level: O3

int av1_get_pred_context_comp_bwdref_p(MACROBLOCKD *xd)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = (uint)xd->neighbors_ref_counts[6] + (uint)xd->neighbors_ref_counts[5];
  iVar1 = 1;
  if (uVar2 != xd->neighbors_ref_counts[7]) {
    iVar1 = (uint)(xd->neighbors_ref_counts[7] <= uVar2) * 2;
  }
  return iVar1;
}

Assistant:

static int get_pred_context_brfarf2_or_arf(const MACROBLOCKD *xd) {
  const uint8_t *const ref_counts = &xd->neighbors_ref_counts[0];

  // Counts of BWDREF, ALTREF2, or ALTREF frames (B, A2, or A)
  const int brfarf2_count =
      ref_counts[BWDREF_FRAME] + ref_counts[ALTREF2_FRAME];
  const int arf_count = ref_counts[ALTREF_FRAME];

  const int pred_context =
      (brfarf2_count == arf_count) ? 1 : ((brfarf2_count < arf_count) ? 0 : 2);

  assert(pred_context >= 0 && pred_context < REF_CONTEXTS);
  return pred_context;
}